

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::LogMessageQuietlyFatal::LogMessageQuietlyFatal
          (LogMessageQuietlyFatal *this,Nonnull<const_char_*> file,int line,
          Nonnull<const_char_*> failure_msg)

{
  LogMessage *pLVar1;
  Nonnull<const_char_*> local_10;
  
  local_10 = failure_msg;
  LogMessageQuietlyFatal(this,file,line);
  pLVar1 = LogMessage::operator<<(&this->super_LogMessage,(char (*) [15])"Check failed: ");
  pLVar1 = LogMessage::operator<<<const_char_*,_0>(pLVar1,&local_10);
  LogMessage::operator<<(pLVar1,(char (*) [2])0x44c6fd);
  return;
}

Assistant:

LogMessageQuietlyFatal::LogMessageQuietlyFatal(
    absl::Nonnull<const char*> file, int line,
    absl::Nonnull<const char*> failure_msg)
    : LogMessageQuietlyFatal(file, line) {
  *this << "Check failed: " << failure_msg << " ";
}